

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.hh
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
MC::MC_Parser::value_type::as<std::__cxx11::string>(value_type *this)

{
  char *__s1;
  int iVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Cjkkkk[P]minisql/build_O1/mc_parser.tab.hh"
                  ,0x13d,"T &MC::MC_Parser::value_type::as() [T = std::basic_string<char>]");
  }
  __s1 = *(char **)(this->yytypeid_ + 8);
  if (__s1 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  }
  if ((*__s1 != '*') &&
     (iVar1 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar1 == 0)) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Cjkkkk[P]minisql/build_O1/mc_parser.tab.hh"
                ,0x13e,"T &MC::MC_Parser::value_type::as() [T = std::basic_string<char>]");
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      YY_ASSERT (yytypeid_);
      YY_ASSERT (*yytypeid_ == typeid (T));
      YY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }